

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

void solve_linear_3x3_system(float *A,float *b,float *ret_x)

{
  undefined1 auVar1 [16];
  undefined4 uVar2;
  uint uVar3;
  undefined1 *puVar4;
  int i;
  long lVar5;
  uint uVar6;
  long unaff_RBP;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 local_38 [8];
  float A_inv [9];
  float fStack_c;
  
  auVar15 = ZEXT816(0) << 0x40;
  lVar5 = 0;
  do {
    lVar7 = lVar5 + 1;
    uVar9 = (ulong)((int)lVar5 - 1);
    lVar8 = 0;
    if (lVar5 != 2) {
      lVar8 = lVar7;
    }
    if (lVar5 == 0) {
      uVar9 = 2;
    }
    auVar1 = vfmsub231ss_fma(ZEXT416((uint)(A[lVar8 + 6] * A[uVar9 + 3])),
                             ZEXT416((uint)A[lVar8 + 3]),ZEXT416((uint)A[uVar9 + 6]));
    auVar15 = vfmadd231ss_fma(auVar15,auVar1,ZEXT416((uint)A[lVar5]));
    lVar5 = lVar7;
  } while (lVar7 != 3);
  auVar1 = vpmovsxbd_avx(ZEXT416(0x6030006));
  uVar3 = 2;
  lVar5 = -0x24;
  fVar14 = 1.0 / auVar15._0_4_;
  auVar15 = vpmovsxbd_avx(ZEXT416(0xc000603));
  do {
    uVar6 = uVar3 % 3;
    auVar10 = vpbroadcastd_avx512vl();
    uVar3 = uVar3 + 1;
    auVar11 = vpbroadcastd_avx512vl();
    auVar12 = vpaddd_avx(auVar11,auVar15);
    auVar11 = vpaddd_avx(auVar11,auVar1);
    vpmovzxdq_avx2(auVar12);
    vpmovzxdq_avx2(auVar11);
    auVar12 = vgatherqps_avx512vl(*(undefined8 *)(A + unaff_RBP));
    vpaddd_avx(auVar10,auVar1);
    vpaddd_avx(auVar10,auVar15);
    auVar11 = vgatherdps_avx512vl(A[unaff_RBP]);
    auVar11._12_4_ = 0;
    auVar10 = vgatherdps_avx512vl(*A);
    auVar13 = vgatherqps_avx512vl(*(undefined8 *)(A + uVar6));
    auVar17._0_4_ = auVar13._0_4_ * auVar10._0_4_;
    auVar17._4_4_ = auVar13._4_4_ * auVar10._4_4_;
    auVar17._8_4_ = auVar13._8_4_ * auVar10._8_4_;
    auVar17._12_4_ = auVar13._12_4_ * 0.0;
    auVar12 = vfmsub231ps_fma(auVar17,auVar12,auVar11);
    uVar2 = *(undefined4 *)(&stack0xfffffffffffffff8 + lVar5);
    *(float *)((long)A_inv + lVar5 + 0x1c) = fVar14 * auVar12._0_4_;
    *(float *)((long)A_inv + lVar5 + 0x20) = fVar14 * auVar12._4_4_;
    *(float *)((long)&fStack_c + lVar5) = fVar14 * auVar12._8_4_;
    *(undefined4 *)(&stack0xfffffffffffffff8 + lVar5) = uVar2;
    lVar5 = lVar5 + 0xc;
  } while (lVar5 != 0);
  puVar4 = local_38;
  ret_x[0] = 0.0;
  ret_x[1] = 0.0;
  lVar5 = 0;
  ret_x[2] = 0.0;
  do {
    auVar16 = ZEXT464((uint)ret_x[lVar5]);
    lVar7 = 0;
    do {
      auVar15 = vfmadd231ss_fma(auVar16._0_16_,ZEXT416(*(uint *)(puVar4 + lVar7 * 4)),
                                ZEXT416((uint)b[lVar7]));
      auVar16 = ZEXT1664(auVar15);
      lVar7 = lVar7 + 1;
      ret_x[lVar5] = auVar15._0_4_;
    } while (lVar7 != 3);
    lVar5 = lVar5 + 1;
    puVar4 = puVar4 + 0xc;
  } while (lVar5 != 3);
  return;
}

Assistant:

void solve_linear_3x3_system(float A[9], float b[3], float ret_x[3]) {

    assert((A != NULL) && (b != NULL) && (ret_x != NULL));

    // computing determinant and inverse determinant of A
    float det = 0.0f;
    for (int i = 0; i < 3; ++i) {
       det += A[0*3 + i] * (A[1*3 + (i+1)%3] * A[2*3 + (i+2)%3] - A[1*3 + (i+2)%3] * A[2*3 + (i+1)%3]);
    }
    float det_inv = 1.0f / det;

    // computing inverse of 3x3 matrix A with inverse determinant
    float A_inv[9];
    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            A_inv[i*3 + j] = det_inv * ((A[((j+1)%3)*3 + (i+1)%3] * A[((j+2)%3)*3 + (i+2)%3]) - (A[((j+1)%3)*3 + (i+2)%3] * A[((j+2)%3)*3 + (i+1)%3]));
        }
    }

    // computing solution vector x = A_inv * b
    ret_x[0] = 0.0f;
    ret_x[1] = 0.0f;
    ret_x[2] = 0.0f;
    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            ret_x[i] += A_inv[i*3 + j] * b[j];
        }
    }

}